

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O1

int extract_motion_vectors(char *videopath)

{
  long lVar1;
  AVStream *pAVar2;
  long lVar3;
  int iVar4;
  AVFormatContext *pAVar5;
  int iVar6;
  uint uVar7;
  AVCodecContext *pAVar8;
  FILE *__s;
  long lVar9;
  ulong uVar10;
  short *psVar11;
  char *pcVar12;
  size_t __size;
  short *psVar13;
  short *psVar14;
  ulong uVar15;
  AVCodec *dec;
  AVPacket pkt;
  char acStack_1d0 [264];
  undefined8 local_98;
  undefined8 local_90;
  AVPacket local_88;
  
  local_88.duration = 0;
  local_88.pos = 0;
  local_88.side_data = (AVPacketSideData *)0x0;
  local_88.side_data_elems = 0;
  local_88._60_4_ = 0;
  local_88.size = 0;
  local_88.stream_index = 0;
  local_88.flags = 0;
  local_88._44_4_ = 0;
  local_88.dts = 0;
  local_88.data = (uint8_t *)0x0;
  local_88.buf = (AVBufferRef *)0x0;
  local_88.pts = 0;
  local_88.convergence_duration = 0;
  src_filename = videopath;
  iVar6 = avformat_open_input(&fmt_ctx,videopath,0,0);
  if (iVar6 < 0) {
    extract_motion_vectors_cold_8();
  }
  else {
    iVar6 = avformat_find_stream_info(fmt_ctx,0);
    pAVar5 = fmt_ctx;
    if (-1 < iVar6) {
      local_98 = 0;
      local_90 = 0;
      uVar7 = av_find_best_stream(fmt_ctx,0,0xffffffff,0xffffffff,&local_98,0);
      if ((int)uVar7 < 0) {
        extract_motion_vectors_cold_4();
      }
      else {
        pAVar2 = pAVar5->streams[uVar7];
        pAVar8 = (AVCodecContext *)avcodec_alloc_context3(local_98);
        if (pAVar8 == (AVCodecContext *)0x0) {
          extract_motion_vectors_cold_3();
        }
        else {
          iVar6 = avcodec_parameters_to_context(pAVar8,pAVar2->codecpar);
          if (iVar6 < 0) {
            extract_motion_vectors_cold_2();
          }
          else {
            av_dict_set(&local_90,"flags2","+export_mvs",0);
            iVar6 = avcodec_open2(pAVar8,local_98,&local_90);
            if (iVar6 < 0) {
              extract_motion_vectors_cold_1();
            }
            else {
              video_stream = pAVar5->streams[uVar7];
              video_stream_idx = uVar7;
              video_dec_ctx = pAVar8;
            }
          }
        }
      }
      uVar7 = 0;
      av_dump_format(fmt_ctx,0,src_filename,0);
      if (video_stream == (AVStream *)0x0) {
        extract_motion_vectors_cold_6();
      }
      else {
        frame = (AVFrame *)av_frame_alloc();
        if (frame == (AVFrame *)0x0) {
          extract_motion_vectors_cold_5();
          uVar7 = 1;
        }
        else {
          putchar(10);
          puts(
              "**************************************************************************************"
              );
          puts(
              "*       Tool : MV-Tractus                                                            *"
              );
          puts(
              "*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *"
              );
          puts(
              "*  Used Libs : FFmpeg                                                                *"
              );
          puts(
              "*Description : A simple tool to extract motion vectors from MPEG videos              *"
              );
          puts(
              "**************************************************************************************"
              );
          putchar(10);
          puts(
              "--------------------------------------------------------------------------------------"
              );
          puts(
              "framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags"
              );
          puts(
              "--------------------------------------------------------------------------------------"
              );
          iVar6 = 0;
          do {
            uVar7 = av_read_frame(fmt_ctx,&local_88);
            if ((int)uVar7 < 0) break;
            if (local_88.stream_index == video_stream_idx) {
              iVar6 = decode_packet(&local_88);
            }
            av_packet_unref();
          } while (-1 < iVar6);
          decode_packet((AVPacket *)0x0);
          puts(
              "\n--------------------------------------------------------------------------------------"
              );
          uVar7 = ~uVar7 >> 0x1f;
        }
      }
      avcodec_free_context(&video_dec_ctx);
      avformat_close_input(&fmt_ctx);
      av_frame_free(&frame);
      return uVar7;
    }
  }
  extract_motion_vectors_cold_7();
  iVar6 = avcodec_send_packet(video_dec_ctx);
  memset(acStack_1d0,0,0xff);
  if (iVar6 < 0) {
    decode_packet_cold_3();
  }
  else {
    while ((iVar6 = avcodec_receive_frame(video_dec_ctx,frame), iVar6 != -0x20464f45 &&
           (iVar6 != -0xb))) {
      if (iVar6 < 0) {
        decode_packet_cold_2();
        return iVar6;
      }
      video_frame_count = video_frame_count + 1;
      sprintf(acStack_1d0,"./output/mv/%d.json");
      pcVar12 = "w";
      __s = fopen(acStack_1d0,"w");
      if (__s == (FILE *)0x0) {
        decode_packet_cold_1();
        iVar6 = extract_motion_vectors(*(char **)(pcVar12 + 8));
        return iVar6;
      }
      fwrite("[\n",2,1,__s);
      lVar9 = av_frame_get_side_data(frame,8);
      if ((lVar9 != 0) && (0x27 < (ulong)(long)*(int *)(lVar9 + 0x10))) {
        lVar3 = *(long *)(lVar9 + 8);
        uVar10 = (ulong)(long)*(int *)(lVar9 + 0x10) / 0x28;
        psVar14 = (short *)(lVar3 + 8);
        uVar15 = 0;
        do {
          lVar1 = lVar3 + uVar15 * 0x28;
          fwrite("\t{\n",3,1,__s);
          fprintf(__s,"\t\t\"source\" : %d,\n",(ulong)*(uint *)(psVar14 + -4));
          fprintf(__s,"\t\t\"width\" : %d,\n",(ulong)*(byte *)(psVar14 + -2));
          fprintf(__s,"\t\t\"height\" : %d,\n",(ulong)*(byte *)((long)psVar14 + -3));
          iVar6 = *(int *)(psVar14 + -4);
          if (uVar15 == uVar10 - 1) {
            if (iVar6 < 0) {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar14[-1] / (long)-iVar6 & 0xffffffff
                     );
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)*psVar14 / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar14[1] / (long)iVar4 & 0xffffffff);
              psVar13 = psVar14 + 2;
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)psVar14[2] / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dx\" : %d,\n",
                      (long)((int)psVar14[1] - (int)psVar14[-1]) / (long)iVar4 & 0xffffffff);
              psVar11 = psVar14;
            }
            else {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar14[1] / (long)iVar6 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar14[2] / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar14[-1] / (long)iVar4 & 0xffffffff)
              ;
              psVar13 = (short *)(lVar1 + 8);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar14 / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dx\" : %d,\n",
                      (long)((int)psVar14[-1] - (int)psVar14[1]) / (long)iVar4 & 0xffffffff);
              psVar11 = (short *)(lVar1 + 0xc);
            }
            iVar6 = *(int *)(psVar14 + -4);
            iVar4 = -iVar6;
            if (0 < iVar6) {
              iVar4 = iVar6;
            }
            fprintf(__s,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar13 - (int)*psVar11) / (long)iVar4 & 0xffffffff);
            __size = 3;
            pcVar12 = "\t}\n";
          }
          else {
            if (iVar6 < 0) {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar14[-1] / (long)-iVar6 & 0xffffffff
                     );
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)*psVar14 / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar14[1] / (long)iVar4 & 0xffffffff);
              psVar13 = psVar14 + 2;
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)psVar14[2] / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dx\" : %d,\n",
                      (long)((int)psVar14[1] - (int)psVar14[-1]) / (long)iVar4 & 0xffffffff);
              psVar11 = psVar14;
            }
            else {
              fprintf(__s,"\t\t\"src_x\" : %d,\n",(long)(int)psVar14[1] / (long)iVar6 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"src_y\" : %d,\n",(long)(int)psVar14[2] / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_x\" : %d,\n",(long)(int)psVar14[-1] / (long)iVar4 & 0xffffffff)
              ;
              psVar13 = (short *)(lVar1 + 8);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar14 / (long)iVar4 & 0xffffffff);
              iVar6 = *(int *)(psVar14 + -4);
              iVar4 = -iVar6;
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              fprintf(__s,"\t\t\"dx\" : %d,\n",
                      (long)((int)psVar14[-1] - (int)psVar14[1]) / (long)iVar4 & 0xffffffff);
              psVar11 = (short *)(lVar1 + 0xc);
            }
            iVar6 = *(int *)(psVar14 + -4);
            iVar4 = -iVar6;
            if (0 < iVar6) {
              iVar4 = iVar6;
            }
            fprintf(__s,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar13 - (int)*psVar11) / (long)iVar4 & 0xffffffff);
            __size = 4;
            pcVar12 = "\t},\n";
          }
          fwrite(pcVar12,__size,1,__s);
          uVar15 = uVar15 + 1;
          uVar10 = (ulong)(long)*(int *)(lVar9 + 0x10) / 0x28;
          psVar14 = psVar14 + 0x14;
        } while (uVar15 < uVar10);
      }
      fwrite("]\n",2,1,__s);
      fclose(__s);
      printf("\rTotal Processed Frames:%d",(ulong)(uint)video_frame_count);
      fflush(_stdout);
      av_frame_unref(frame);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int extract_motion_vectors(char *videopath){
    int ret = 0;
    AVPacket pkt = { 0 };
    struct stat sb;
    // char command[50];
    // char output[13]="./output/mv/";
    // if (!(stat(output, &sb) == 0 && S_ISDIR(sb.st_mode)))
    // {
    //     sprintf(command,"mkdir %s", output);
	  //     system(command);
    // }

    /*if (argc != 2) {
        fprintf(stderr, "Usage: %s <video>\n", argv[0]);
        exit(1);
    }*/

    src_filename = videopath;

    if (avformat_open_input(&fmt_ctx, src_filename, NULL, NULL) < 0) {
        fprintf(stderr, "Could not open source file %s\n", src_filename);
        exit(1);
    }

    if (avformat_find_stream_info(fmt_ctx, NULL) < 0) {
        fprintf(stderr, "Could not find stream information\n");
        exit(1);
    }

    open_codec_context(fmt_ctx, AVMEDIA_TYPE_VIDEO);

    av_dump_format(fmt_ctx, 0, src_filename, 0);

    if (!video_stream) {
        fprintf(stderr, "Could not find video stream in the input, aborting\n");
        ret = 1;
        goto end;
    }

    frame = av_frame_alloc();
    if (!frame) {
        fprintf(stderr, "Could not allocate frame\n");
        ret = AVERROR(ENOMEM);
        goto end;
    }
    printf("\n");
    printf("**************************************************************************************\n");
    printf("*       Tool : MV-Tractus                                                            *\n");
    printf("*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *\n");
    printf("*  Used Libs : FFmpeg                                                                *\n");
    printf("*Description : A simple tool to extract motion vectors from MPEG videos              *\n");
    printf("**************************************************************************************\n");
    printf("\n");
    printf("--------------------------------------------------------------------------------------\n");
    printf("framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags\n");
    printf("--------------------------------------------------------------------------------------\n");

    /* read frames from the file */
    while (av_read_frame(fmt_ctx, &pkt) >= 0) {
        if (pkt.stream_index == video_stream_idx)
            ret = decode_packet(&pkt);
        av_packet_unref(&pkt);
        if (ret < 0)
            break;
    }

    /* flush cached frames */
    decode_packet(NULL);
    printf("\n--------------------------------------------------------------------------------------\n");

end:
    avcodec_free_context(&video_dec_ctx);
    avformat_close_input(&fmt_ctx);
    av_frame_free(&frame);
    return ret < 0;
}